

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Thread::PushValues(Thread *this,ValueTypes *types,Values *values)

{
  pointer *ppVVar1;
  pointer pTVar2;
  iterator __position;
  iterator __position_00;
  undefined8 uVar3;
  undefined4 uVar4;
  uint uVar5;
  pointer pTVar6;
  Value *__args;
  long lVar7;
  ulong uVar8;
  uint local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<wabt::interp::Value,std::allocator<wabt::interp::Value>> *local_38;
  
  pTVar6 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pTVar2 - (long)pTVar6 >> 2 ==
      ((long)(values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    if (pTVar2 != pTVar6) {
      local_38 = (vector<wabt::interp::Value,std::allocator<wabt::interp::Value>> *)&this->values_;
      local_40 = &this->refs_;
      lVar7 = 0;
      uVar8 = 0;
      do {
        uVar5 = pTVar6[uVar8].enum_ + ~(Func|I32U);
        if ((uVar5 < 9) && ((0x181U >> (uVar5 & 0x1f) & 1) != 0)) {
          local_44 = (int)((ulong)((long)(this->values_).
                                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->values_).
                                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555;
          __position._M_current =
               (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_40,__position,&local_44);
          }
          else {
            *__position._M_current = local_44;
            (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        __args = (Value *)((long)&((values->
                                   super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar7);
        __position_00._M_current =
             (this->values_).
             super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->values_).
            super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>::
          _M_realloc_insert<wabt::interp::Value_const&>(local_38,__position_00,__args);
        }
        else {
          uVar4 = *(undefined4 *)&__args->field_0x14;
          (__position_00._M_current)->type = (ValueType)(__args->type).enum_;
          *(undefined4 *)&(__position_00._M_current)->field_0x14 = uVar4;
          uVar3 = *(undefined8 *)((long)&__args->field_0 + 8);
          ((__position_00._M_current)->field_0).i64_ = (__args->field_0).i64_;
          *(undefined8 *)((long)&(__position_00._M_current)->field_0 + 8) = uVar3;
          ppVVar1 = &(this->values_).
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
        uVar8 = uVar8 + 1;
        pTVar6 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x18;
      } while (uVar8 < (ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 2))
      ;
    }
    return;
  }
  __assert_fail("types.size() == values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp.cc"
                ,0x39f,"void wabt::interp::Thread::PushValues(const ValueTypes &, const Values &)");
}

Assistant:

void Thread::PushValues(const ValueTypes& types, const Values& values) {
  assert(types.size() == values.size());
  for (size_t i = 0; i < types.size(); ++i) {
    if (IsReference(types[i])) {
      refs_.push_back(values_.size());
    }
    values_.push_back(values[i]);
  }
}